

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O3

void __thiscall Zippy::ZipArchive::ZipArchive(ZipArchive *this,string *fileName)

{
  pointer pcVar1;
  ifstream f;
  long local_228 [4];
  int aiStack_208 [122];
  
  this->_vptr_ZipArchive = (_func_int **)&PTR__ZipArchive_0017ed70;
  (this->m_Archive).m_archive_size = 0;
  (this->m_Archive).m_central_directory_file_ofs = 0;
  (this->m_Archive).m_total_files = 0;
  (this->m_Archive).m_zip_mode = MZ_ZIP_MODE_INVALID;
  (this->m_Archive).m_zip_type = MZ_ZIP_TYPE_INVALID;
  (this->m_Archive).m_last_error = MZ_ZIP_NO_ERROR;
  (this->m_Archive).m_file_offset_alignment = 0;
  (this->m_Archive).m_pAlloc = (mz_alloc_func)0x0;
  (this->m_Archive).m_pFree = (mz_free_func)0x0;
  (this->m_Archive).m_pRealloc = (mz_realloc_func)0x0;
  (this->m_Archive).m_pFree = (mz_free_func)0x0;
  (this->m_Archive).m_pRealloc = (mz_realloc_func)0x0;
  (this->m_Archive).m_pAlloc_opaque = (void *)0x0;
  (this->m_Archive).m_pRead = (mz_file_read_func)0x0;
  (this->m_Archive).m_pWrite = (mz_file_write_func)0x0;
  (this->m_Archive).m_pNeeds_keepalive = (mz_file_needs_keepalive)0x0;
  (this->m_Archive).m_pIO_opaque = (void *)0x0;
  (this->m_Archive).m_pState = (mz_zip_internal_state *)0x0;
  (this->m_ArchivePath)._M_dataplus._M_p = (pointer)&(this->m_ArchivePath).field_2;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_ArchivePath,pcVar1,pcVar1 + fileName->_M_string_length);
  this->m_IsOpen = false;
  (this->m_ZipEntries).
  super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ZipEntries).
  super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ZipEntries).
  super__Vector_base<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::ifstream::ifstream(local_228,(fileName->_M_dataplus)._M_p,_S_in);
  if (*(int *)((long)aiStack_208 + *(long *)(local_228[0] + -0x18)) == 0) {
    std::ifstream::close();
    Open(this,fileName);
  }
  else {
    std::ifstream::close();
    Create(this,fileName);
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

explicit ZipArchive(const std::string& fileName)
                : m_ArchivePath(fileName) {

            // ===== Open file stream
            std::ifstream f(fileName.c_str());

            // ===== If successful, continue to open the file.
            if (f.good()) {
                f.close();
                Open(fileName);
            }

            // ===== If unsuccessful, create the archive file and continue.
            else {
                f.close();
                Create(fileName);
            }

        }